

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  uint8 uVar1;
  hmm_context_t *phVar2;
  int32 *piVar3;
  uint8 ***pppuVar4;
  bool bVar5;
  uint16 *puVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int32 iVar15;
  uint16 *puVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  
  phVar2 = hmm->ctx;
  uVar1 = hmm->mpx;
  uVar7 = hmm->senid[0];
  if (uVar1 != '\0') {
    if (uVar7 == 0xffff) {
      uVar7 = 0xffff;
    }
    else {
      uVar7 = *phVar2->sseq[uVar7];
    }
  }
  if (uVar7 == 0xffff) {
    iVar8 = -0x20000000;
  }
  else {
    uVar7 = hmm->senid[0];
    if (uVar1 != '\0') {
      if (uVar7 == 0xffff) {
        uVar7 = 0xffff;
      }
      else {
        uVar7 = *phVar2->sseq[uVar7];
      }
    }
    iVar8 = -(int)phVar2->senscore[uVar7];
  }
  piVar3 = phVar2->st_sen_scr;
  *piVar3 = iVar8 + hmm->score[0];
  uVar17 = (ulong)hmm->n_emit_state;
  if (1 < hmm->n_emit_state) {
    puVar6 = hmm->senid;
    lVar10 = 1;
    lVar12 = 0;
    do {
      puVar6 = puVar6 + 1;
      puVar16 = puVar6;
      if (uVar1 == '\0') {
LAB_0012b228:
        if (*puVar16 == 0xffff) goto LAB_0012b255;
        puVar16 = puVar6;
        if (uVar1 == '\0') {
LAB_0012b24f:
          uVar17 = (ulong)*puVar16;
        }
        else {
          if ((ulong)*puVar6 != 0xffff) {
            puVar16 = phVar2->sseq[*puVar6] + lVar10;
            goto LAB_0012b24f;
          }
          uVar17 = 0xffff;
        }
        iVar8 = -(int)phVar2->senscore[uVar17];
      }
      else {
        if ((ulong)*puVar6 != 0xffff) {
          puVar16 = phVar2->sseq[*puVar6] + lVar10;
          goto LAB_0012b228;
        }
LAB_0012b255:
        iVar8 = -0x20000000;
      }
      iVar15 = iVar8 + hmm->score[lVar12 + 1];
      if (iVar15 < -0x1fffffff) {
        iVar15 = -0x20000000;
      }
      piVar3[lVar12 + 1] = iVar15;
      lVar10 = lVar10 + 1;
      uVar17 = (ulong)hmm->n_emit_state;
      uVar13 = lVar12 + 2;
      lVar12 = lVar12 + 1;
    } while (uVar13 < uVar17);
  }
  uVar11 = (int)uVar17 - 1;
  uVar13 = (ulong)uVar11;
  if ((char)uVar17 == '\0') {
    iVar8 = -0x20000000;
    uVar21 = 0xffffffff;
  }
  else {
    uVar21 = 0xffffffff;
    iVar8 = -0x20000000;
    lVar12 = uVar13 + 1;
    do {
      if ((phVar2->tp[hmm->tmatid][lVar12 + -1][uVar17] != 0xff) &&
         (iVar18 = piVar3[lVar12 + -1] - (uint)phVar2->tp[hmm->tmatid][lVar12 + -1][uVar17],
         iVar8 < iVar18)) {
        iVar8 = iVar18;
        uVar21 = uVar11;
      }
      uVar11 = uVar11 - 1;
      lVar10 = lVar12 + -1;
      bVar5 = 0 < lVar12;
      lVar12 = lVar10;
    } while (lVar10 != 0 && bVar5);
  }
  hmm->out_score = iVar8;
  if (-1 < (int)uVar21) {
    hmm->out_history = hmm->history[uVar21];
  }
  if ((int)uVar17 != 0) {
    pppuVar4 = phVar2->tp;
    uVar14 = uVar13;
    do {
      uVar13 = uVar13 - 1;
      uVar11 = (uint)pppuVar4[hmm->tmatid][uVar14][uVar14];
      if (uVar11 == 0xff) {
        iVar18 = -0x20000000;
      }
      else {
        iVar18 = piVar3[uVar14] - uVar11;
      }
      uVar11 = 0xffffffff;
      iVar9 = (int)uVar17;
      uVar20 = uVar13;
      if (0 < (long)uVar14) {
        do {
          uVar21 = (uint)pppuVar4[hmm->tmatid][uVar20 & 0xffffffff][uVar14];
          if (uVar21 != 0xff) {
            iVar19 = piVar3[uVar20 & 0xffffffff] - uVar21;
            if (iVar18 < iVar19) {
              iVar18 = iVar19;
              uVar11 = (int)uVar17 - 2;
            }
          }
          uVar21 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar21;
          uVar20 = uVar20 - 1;
        } while (1 < (int)uVar21);
      }
      if (uVar14 == 0) {
        hmm->score[0] = iVar18;
        if (-1 < (int)uVar11) {
          hmm->history[0] = hmm->history[uVar11];
        }
      }
      else {
        hmm->score[uVar14] = iVar18;
        if (-1 < (int)uVar11) {
          hmm->history[uVar14] = hmm->history[uVar11];
        }
      }
      if ((uVar1 != '\0') && (-1 < (int)uVar11)) {
        hmm->senid[uVar14] = hmm->senid[uVar11];
      }
      if (iVar8 <= iVar18) {
        iVar8 = iVar18;
      }
      uVar17 = (ulong)(iVar9 - 1);
      bVar5 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar5);
  }
  hmm->bestscore = iVar8;
  return iVar8;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) WORSE_THAN WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) BETTER_THAN TMAT_WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        /* Propagate ssid for multiplex HMMs */
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->senid[to] = hmm->senid[bestfrom];

        if (bestscr WORSE_THAN scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}